

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

Symbol * slang::ast::InstanceSymbol::createDefaultNested
                   (Scope *scope,ModuleDeclarationSyntax *syntax)

{
  LookupLocation lookupLocation;
  int iVar1;
  InstanceNameSyntax *this;
  Token *args_3;
  undefined4 extraout_var;
  reference ppSVar2;
  EVP_PKEY_CTX *src;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  Token TVar3;
  Symbol *result;
  SmallVector<const_slang::ast::Symbol_*,_5UL> implicitNets;
  SmallVector<const_slang::ast::Symbol_*,_5UL> results;
  ASTContext context;
  HierarchyInstantiationSyntax *instantiation;
  BindDirectiveInfo *in_stack_000001e8;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_000001f0;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_000001f8;
  ASTContext *in_stack_00000200;
  HierarchyInstantiationSyntax *in_stack_00000208;
  Compilation *in_stack_00000210;
  HierarchicalInstanceSyntax *instance;
  InstanceNameSyntax *instName;
  SourceLocation loc;
  ModuleHeaderSyntax *header;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> instances;
  anon_class_8_1_898a5c0d missing;
  Compilation *comp;
  SyntaxNode *in_stack_fffffffffffffd08;
  undefined6 in_stack_fffffffffffffd10;
  TokenKind in_stack_fffffffffffffd16;
  ASTContext *in_stack_fffffffffffffd18;
  Symbol *this_00;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd20;
  Scope *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffd60;
  Token *in_stack_fffffffffffffd68;
  BumpAllocator *in_stack_fffffffffffffd70;
  Compilation *args_2;
  Token *args_1;
  InstanceNameSyntax **args;
  Token *in_stack_fffffffffffffdc8;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_fffffffffffffdd0;
  void **in_stack_fffffffffffffdd8;
  Token *in_stack_fffffffffffffde0;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffde8;
  BumpAllocator *in_stack_fffffffffffffdf0;
  SmallVectorBase<const_slang::ast::Symbol_*> local_1f0 [2];
  bitmask<slang::ast::ASTFlags> local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_160;
  undefined8 local_150;
  HierarchyInstantiationSyntax *local_138;
  SourceLocation local_118;
  Token local_110;
  SourceLocation local_f0;
  Token *local_e8;
  Info *local_e0;
  HierarchicalInstanceSyntax *local_d8;
  InstanceNameSyntax *local_d0 [2];
  InstanceNameSyntax *local_c0;
  SourceLocation local_b8;
  ModuleHeaderSyntax *local_a0;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_98 [2];
  Compilation *local_20;
  Compilation *local_18;
  SyntaxNode *local_10;
  
  local_10 = in_RSI;
  local_20 = Scope::getCompilation(in_RDI);
  local_18 = local_20;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x39deb9);
  local_a0 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator*
                       ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0x39deca);
  local_b8 = parsing::Token::location(&local_a0->name);
  args_1 = &local_a0->name;
  args = local_d0;
  args_2 = local_18;
  std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::span
            ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)0x39df48);
  this = BumpAllocator::
         emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token&,std::span<slang::syntax::VariableDimensionSyntax*,18446744073709551615ul>>
                   (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  local_f0 = local_b8;
  local_c0 = this;
  TVar3 = createDefaultNested::anon_class_8_1_898a5c0d::operator()
                    ((anon_class_8_1_898a5c0d *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd16,
                     (SourceLocation)in_stack_fffffffffffffd20.m_bits);
  local_e0 = TVar3.info;
  args_3 = TVar3._0_8_;
  local_e8 = args_3;
  std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
            ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x39dff5);
  local_118 = local_b8;
  local_110 = createDefaultNested::anon_class_8_1_898a5c0d::operator()
                        ((anon_class_8_1_898a5c0d *)in_stack_fffffffffffffd18,
                         in_stack_fffffffffffffd16,(SourceLocation)in_stack_fffffffffffffd20.m_bits)
  ;
  local_d8 = BumpAllocator::
             emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::InstanceNameSyntax*&,slang::parsing::Token,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token>
                       ((BumpAllocator *)this,args,args_1,
                        (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)args_2,args_3)
  ;
  slang::syntax::TokenOrSyntax::TokenOrSyntax
            ((TokenOrSyntax *)CONCAT26(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)
             CONCAT26(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10),
             (TokenOrSyntax *)in_stack_fffffffffffffd08);
  std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
            ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)0x39e0cb);
  local_150 = 0;
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy(local_98,(EVP_PKEY_CTX *)local_18,src)
  ;
  local_160 = CONCAT44(extraout_var,iVar1);
  local_138 = BumpAllocator::
              emplace<slang::syntax::HierarchyInstantiationSyntax,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token&,decltype(nullptr),std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                        (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                         in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                         in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_1a8 = LookupLocation::max;
  uStack_1a0 = DAT_00de66d0;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_1b0,None);
  lookupLocation._8_8_ = in_stack_fffffffffffffd30;
  lookupLocation.scope = in_stack_fffffffffffffd28;
  ASTContext::ASTContext
            (in_stack_fffffffffffffd18,
             (Scope *)CONCAT26(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10),lookupLocation,
             in_stack_fffffffffffffd20);
  SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x39e1da);
  SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x39e1ec);
  fromSyntax(in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8,
             in_stack_000001f0,in_stack_000001e8,&instance->super_SyntaxNode);
  ppSVar2 = SmallVectorBase<const_slang::ast::Symbol_*>::operator[](local_1f0,0);
  this_00 = *ppSVar2;
  if (this_00->kind == Instance) {
    Symbol::setSyntax(this_00,local_10);
  }
  SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x39e2e2);
  SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x39e2ef);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x39e2fc);
  return this_00;
}

Assistant:

Symbol& InstanceSymbol::createDefaultNested(const Scope& scope,
                                            const ModuleDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto missing = [&](TokenKind tk, SourceLocation loc) {
        return Token::createMissing(comp, tk, loc);
    };

    // Fabricate a fake instantiation syntax to let us reuse all of the real logic
    // with this nested module case as well.
    SmallVector<TokenOrSyntax, 4> instances;
    auto& header = *syntax.header;
    auto loc = header.name.location();
    auto instName = comp.emplace<InstanceNameSyntax>(header.name,
                                                     std::span<VariableDimensionSyntax*>());
    auto instance = comp.emplace<HierarchicalInstanceSyntax>(
        instName, missing(TokenKind::OpenParenthesis, loc), std::span<TokenOrSyntax>(),
        missing(TokenKind::CloseParenthesis, loc));

    instances.push_back(instance);

    auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
        std::span<AttributeInstanceSyntax*>(), header.name, nullptr, instances.copy(comp),
        header.semi);

    ASTContext context(scope, LookupLocation::max);
    SmallVector<const Symbol*> results;
    SmallVector<const Symbol*> implicitNets;
    fromSyntax(comp, *instantiation, context, results, implicitNets, nullptr, &syntax);
    SLANG_ASSERT(implicitNets.empty());
    SLANG_ASSERT(results.size() == 1);

    // We just created this symbol; it's safe to const cast it here.
    auto& result = const_cast<Symbol&>(*results[0]);

    // Swap the syntax back to our original definition syntax
    // so that it's findable in bind directives via the original
    // syntax and not one we just made up.
    if (result.kind == SymbolKind::Instance)
        result.setSyntax(syntax);
    return result;
}